

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::setTrianglePointsNonindiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  GLfloat *pGVar3;
  AdjacencyGridTriangle *pAVar4;
  AdjacencyGridTriangle *trianglePtr;
  GLfloat *pGStack_30;
  uint n;
  float *travellerPtr;
  float *travellerExpectedGeometryPtr;
  float *travellerExpectedAdjacencyGeometryPtr;
  AdjacencyTestData *test_data_local;
  GeometryShaderAdjacencyTests *this_local;
  
  test_data->m_n_vertices = test_data->m_grid->m_n_triangles * this->m_n_vertices_per_triangle;
  test_data->m_geometry_bo_size =
       test_data->m_grid->m_n_triangles * this->m_n_vertices_per_triangle *
       this->m_n_components_output * 4;
  test_data->m_vertex_data_bo_size = test_data->m_n_vertices * this->m_n_components_input * 8;
  auVar1 = ZEXT416(test_data->m_geometry_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_expected_adjacency_geometry = pGVar3;
  auVar1 = ZEXT416(test_data->m_geometry_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_expected_geometry = pGVar3;
  auVar1 = ZEXT416(test_data->m_vertex_data_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_vertex_data = pGVar3;
  travellerExpectedGeometryPtr = test_data->m_expected_adjacency_geometry;
  travellerPtr = test_data->m_expected_geometry;
  pGStack_30 = test_data->m_vertex_data;
  for (trianglePtr._4_4_ = 0; trianglePtr._4_4_ < test_data->m_grid->m_n_triangles;
      trianglePtr._4_4_ = trianglePtr._4_4_ + 1) {
    pAVar4 = test_data->m_grid->m_triangles + trianglePtr._4_4_;
    *pGStack_30 = pAVar4->m_vertex_x->x;
    pGStack_30[1] = pAVar4->m_vertex_x->y;
    pGStack_30[2] = pAVar4->m_vertex_x_adjacent->x;
    pGStack_30[3] = pAVar4->m_vertex_x_adjacent->y;
    pGStack_30[4] = pAVar4->m_vertex_y->x;
    pGStack_30[5] = pAVar4->m_vertex_y->y;
    pGStack_30[6] = pAVar4->m_vertex_y_adjacent->x;
    pGStack_30[7] = pAVar4->m_vertex_y_adjacent->y;
    pGStack_30[8] = pAVar4->m_vertex_z->x;
    pGStack_30[9] = pAVar4->m_vertex_z->y;
    pGStack_30[10] = pAVar4->m_vertex_z_adjacent->x;
    pGStack_30[0xb] = pAVar4->m_vertex_z_adjacent->y;
    pGStack_30 = pGStack_30 + 0xc;
    *travellerExpectedGeometryPtr = pAVar4->m_vertex_x_adjacent->x;
    travellerExpectedGeometryPtr[1] = pAVar4->m_vertex_x_adjacent->y;
    travellerExpectedGeometryPtr[2] = 0.0;
    travellerExpectedGeometryPtr[3] = 1.0;
    travellerExpectedGeometryPtr[4] = pAVar4->m_vertex_y_adjacent->x;
    travellerExpectedGeometryPtr[5] = pAVar4->m_vertex_y_adjacent->y;
    travellerExpectedGeometryPtr[6] = 0.0;
    travellerExpectedGeometryPtr[7] = 1.0;
    travellerExpectedGeometryPtr[8] = pAVar4->m_vertex_z_adjacent->x;
    travellerExpectedGeometryPtr[9] = pAVar4->m_vertex_z_adjacent->y;
    travellerExpectedGeometryPtr[10] = 0.0;
    travellerExpectedGeometryPtr[0xb] = 1.0;
    travellerExpectedGeometryPtr = travellerExpectedGeometryPtr + 0xc;
    *travellerPtr = pAVar4->m_vertex_x->x;
    travellerPtr[1] = pAVar4->m_vertex_x->y;
    travellerPtr[2] = 0.0;
    travellerPtr[3] = 1.0;
    travellerPtr[4] = pAVar4->m_vertex_y->x;
    travellerPtr[5] = pAVar4->m_vertex_y->y;
    travellerPtr[6] = 0.0;
    travellerPtr[7] = 1.0;
    travellerPtr[8] = pAVar4->m_vertex_z->x;
    travellerPtr[9] = pAVar4->m_vertex_z->y;
    travellerPtr[10] = 0.0;
    travellerPtr[0xb] = 1.0;
    travellerPtr = travellerPtr + 0xc;
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setTrianglePointsNonindiced(AdjacencyTestData& test_data)
{
	float* travellerExpectedAdjacencyGeometryPtr = NULL;
	float* travellerExpectedGeometryPtr			 = NULL;
	float* travellerPtr							 = NULL;

	/* Set buffer sizes */
	test_data.m_n_vertices		 = test_data.m_grid->m_n_triangles * m_n_vertices_per_triangle;
	test_data.m_geometry_bo_size = static_cast<glw::GLuint>(
		test_data.m_grid->m_n_triangles * m_n_vertices_per_triangle * m_n_components_output * sizeof(float));
	test_data.m_vertex_data_bo_size = static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input *
															   sizeof(float) * 2); /* include adjacency info */

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected values */
	for (unsigned int n = 0; n < test_data.m_grid->m_n_triangles; ++n)
	{
		AdjacencyGridTriangle* trianglePtr = test_data.m_grid->m_triangles + n;

		*travellerPtr = trianglePtr->m_vertex_x->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_x->y;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_x_adjacent->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_x_adjacent->y;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_y->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_y->y;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_y_adjacent->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_y_adjacent->y;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_z->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_z->y;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_z_adjacent->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_z_adjacent->y;
		++travellerPtr;

		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_x_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_x_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_y_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_y_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_z_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_z_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_x->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_x->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_y->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_y->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_z->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_z->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all triangles) */
}